

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

char * alloc_string(char *in)

{
  size_t sVar1;
  char *pcVar2;
  size_t i;
  size_t sVar3;
  
  sVar1 = lodepng_strlen(in);
  pcVar2 = (char *)malloc(sVar1 + 1);
  if (pcVar2 != (char *)0x0) {
    for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
      pcVar2[sVar3] = in[sVar3];
    }
    pcVar2[sVar1] = '\0';
  }
  return pcVar2;
}

Assistant:

static char* alloc_string(const char* in) {
  size_t insize = lodepng_strlen(in);
  char* out = (char*)lodepng_malloc(insize + 1);
  if(out) {
    size_t i;
    for(i = 0; i != insize; ++i) {
      out[i] = in[i];
    }
    out[i] = 0;
  }
  return out;
}